

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qapplication.cpp
# Opt level: O2

void __thiscall QApplicationPrivate::notifyLayoutDirectionChange(QApplicationPrivate *this)

{
  QWidget *this_00;
  QWidget **ppQVar1;
  long lVar2;
  long lVar3;
  int i;
  undefined1 *puVar4;
  long in_FS_OFFSET;
  QWindow *local_88;
  undefined1 *puStack_80;
  QArrayDataPointer<QWindow_*> local_78;
  QArrayDataPointer<QWidget_*> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_58.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_58.ptr = (QWidget **)&DAT_aaaaaaaaaaaaaaaa;
  QApplication::topLevelWidgets();
  local_78.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_78.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_78.ptr = (QWindow **)&DAT_aaaaaaaaaaaaaaaa;
  QGuiApplication::topLevelWindows();
  ppQVar1 = local_58.ptr;
  lVar3 = local_58.size << 3;
  for (lVar2 = 0; lVar3 != lVar2; lVar2 = lVar2 + 8) {
    this_00 = *(QWidget **)((long)ppQVar1 + lVar2);
    local_88 = QWidget::windowHandle(this_00);
    QtPrivate::sequential_erase_with_copy<QList<QWindow*>,QWindow*>
              ((QList<QWindow_*> *)&local_78,&local_88);
    local_88 = (QWindow *)&DAT_aaaaaaaaaaaaaaaa;
    puStack_80 = &DAT_aaaaaaaaaaaaaaaa;
    QEvent::QEvent((QEvent *)&local_88,ApplicationLayoutDirectionChange);
    QCoreApplication::sendEvent(&this_00->super_QObject,(QEvent *)&local_88);
    QEvent::~QEvent((QEvent *)&local_88);
  }
  for (puVar4 = (undefined1 *)0x0; puVar4 < (ulong)local_78.size; puVar4 = puVar4 + 1) {
    local_88 = (QWindow *)&DAT_aaaaaaaaaaaaaaaa;
    puStack_80 = &DAT_aaaaaaaaaaaaaaaa;
    QEvent::QEvent((QEvent *)&local_88,ApplicationLayoutDirectionChange);
    QCoreApplication::sendEvent((QObject *)local_78.ptr[(long)puVar4],(QEvent *)&local_88);
    QEvent::~QEvent((QEvent *)&local_88);
  }
  QArrayDataPointer<QWindow_*>::~QArrayDataPointer(&local_78);
  QArrayDataPointer<QWidget_*>::~QArrayDataPointer(&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QApplicationPrivate::notifyLayoutDirectionChange()
{
    const QWidgetList list = QApplication::topLevelWidgets();
    QWindowList windowList = QGuiApplication::topLevelWindows();

    // send to all top-level QWidgets
    for (auto *w : list) {
        windowList.removeAll(w->windowHandle());
        QEvent ev(QEvent::ApplicationLayoutDirectionChange);
        QCoreApplication::sendEvent(w, &ev);
    }

    // in case there are any plain QWindows in this QApplication-using
    // application, also send the notification to them
    for (int i = 0; i < windowList.size(); ++i) {
        QEvent ev(QEvent::ApplicationLayoutDirectionChange);
        QCoreApplication::sendEvent(windowList.at(i), &ev);
    }
}